

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O3

bool __thiscall re2::BitState::TrySearch(BitState *this,int id0,char *p0)

{
  ushort uVar1;
  uint uVar2;
  const_pointer pcVar3;
  size_type sVar4;
  uint *puVar5;
  Job *pJVar6;
  StringPiece *pSVar7;
  char **ppcVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  int iVar12;
  uint32_t uVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  byte *pbVar20;
  Inst *pIVar21;
  long lVar22;
  byte *p;
  byte *pbVar23;
  LogMessage local_1b0;
  
  pcVar3 = (this->text_).data_;
  sVar4 = (this->text_).size_;
  this->njob_ = 0;
  iVar15 = ((int)sVar4 + 1) *
           (uint)((_Head_base<0UL,_unsigned_short_*,_false> *)
                 ((long)&(this->prog_->list_heads_).ptr_._M_t.
                         super___uniq_ptr_impl<unsigned_short,_re2::PODArray<unsigned_short>::Deleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_short_*,_re2::PODArray<unsigned_short>::Deleter>
                 + 8))->_M_head_impl[id0];
  iVar12 = (int)p0 - (int)pcVar3;
  uVar16 = iVar15 + iVar12;
  uVar19 = iVar15 + iVar12 + 0x1f;
  if (-1 < (int)uVar16) {
    uVar19 = uVar16;
  }
  puVar5 = (this->visited_).ptr_._M_t.
           super___uniq_ptr_impl<unsigned_int,_re2::PODArray<unsigned_int>::Deleter>._M_t.
           super__Tuple_impl<0UL,_unsigned_int_*,_re2::PODArray<unsigned_int>::Deleter>.
           super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
  uVar17 = puVar5[(int)uVar19 >> 5];
  if ((uVar17 >> (uVar16 & 0x1f) & 1) == 0) {
    puVar5[(int)uVar19 >> 5] = 1 << ((byte)uVar16 & 0x1f) | uVar17;
    Push(this,id0,p0);
    iVar12 = this->njob_;
    if (0 < iVar12) {
      pbVar20 = (byte *)(pcVar3 + sVar4);
      bVar11 = false;
      while( true ) {
        uVar16 = iVar12 - 1;
        this->njob_ = uVar16;
        pJVar6 = (this->job_).ptr_._M_t.
                 super___uniq_ptr_impl<re2::Job,_re2::PODArray<re2::Job>::Deleter>._M_t.
                 super__Tuple_impl<0UL,_re2::Job_*,_re2::PODArray<re2::Job>::Deleter>.
                 super__Head_base<0UL,_re2::Job_*,_false>._M_head_impl;
        uVar19 = pJVar6[uVar16].id;
        uVar14 = (ulong)uVar19;
        pbVar23 = (byte *)pJVar6[uVar16].p;
        if (-1 < (int)uVar19) break;
        (this->cap_).ptr_._M_t.
        super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>._M_t.
        super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>.
        super__Head_base<0UL,_const_char_**,_false>._M_head_impl
        [((_Head_base<0UL,_re2::Prog::Inst_*,_false> *)
         ((long)&(this->prog_->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 _M_t.
                 super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
         + 8))->_M_head_impl[-uVar19].field_1.cap_] = (char *)pbVar23;
switchD_001c1ed4_caseD_7:
        iVar12 = this->njob_;
        if (iVar12 < 1) {
          return bVar11;
        }
      }
      iVar12 = pJVar6[uVar16].rle;
      if (0 < (long)iVar12) {
        pJVar6[uVar16].rle = iVar12 + -1;
        this->njob_ = this->njob_ + 1;
        pbVar23 = pbVar23 + iVar12;
      }
LAB_001c1eb3:
      lVar22 = (long)(int)uVar14;
      pIVar21 = ((_Head_base<0UL,_re2::Prog::Inst_*,_false> *)
                ((long)&(this->prog_->inst_).ptr_._M_t.
                        super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                + 8))->_M_head_impl;
      uVar19 = pIVar21[lVar22].out_opcode_;
      p = pbVar23;
      switch(uVar19 & 7) {
      case 0:
switchD_001c1ed4_caseD_0:
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/bitstate.cc"
                   ,0xa8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0.str_,"Unexpected opcode: ",0x13);
        std::ostream::operator<<((ostream *)&local_1b0.str_,pIVar21[lVar22].out_opcode_ & 7);
        LogMessage::~LogMessage(&local_1b0);
        return false;
      case 1:
switchD_001c1ed4_caseD_1:
        do {
          uVar14 = (ulong)(uVar19 >> 4);
          uVar16 = pIVar21[uVar14].out_opcode_ & 7;
          if (uVar16 == 6) {
            uVar16 = pIVar21[pIVar21[uVar14].out_opcode_ >> 4].out_opcode_ & 7;
          }
          pbVar23 = pbVar20;
          if (uVar16 != 2) goto LAB_001c1f24;
          lVar22 = (long)pIVar21[lVar22].field_1.cap_;
          pIVar21 = ((_Head_base<0UL,_re2::Prog::Inst_*,_false> *)
                    ((long)&(this->prog_->inst_).ptr_._M_t.
                            super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                    + 8))->_M_head_impl;
          uVar19 = pIVar21[lVar22].out_opcode_;
          p = pbVar20;
          switch(uVar19 & 7) {
          case 0:
            goto switchD_001c1ed4_caseD_0;
          case 2:
switchD_001c1ed4_caseD_2:
            uVar16 = 0xffffffff;
            if (p < pbVar20) {
              uVar16 = (uint)*p;
            }
            uVar1 = pIVar21[lVar22].field_1.field_3.hint_foldcase_;
            uVar17 = uVar16 | 0x20;
            if ((uVar1 & 1) == 0) {
              uVar17 = uVar16;
            }
            if (0x19 < uVar16 - 0x41) {
              uVar17 = uVar16;
            }
            if ((int)uVar17 < (int)(uint)pIVar21[lVar22].field_1.field_3.lo_) goto LAB_001c2033;
            if ((int)(uint)pIVar21[lVar22].field_1.field_3.hi_ < (int)uVar17) goto LAB_001c2033;
            if (1 < uVar1) {
              Push(this,(uint)(uVar1 >> 1) + (int)lVar22,(char *)p);
            }
            pbVar23 = p + 1;
            do {
              uVar16 = pIVar21[lVar22].out_opcode_ >> 4;
              iVar12 = ((int)(this->text_).size_ + 1) *
                       (uint)((_Head_base<0UL,_unsigned_short_*,_false> *)
                             ((long)&(this->prog_->list_heads_).ptr_._M_t.
                                     super___uniq_ptr_impl<unsigned_short,_re2::PODArray<unsigned_short>::Deleter>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_unsigned_short_*,_re2::PODArray<unsigned_short>::Deleter>
                             + 8))->_M_head_impl[uVar16];
              iVar15 = (int)pbVar23 - *(int *)&(this->text_).data_;
              uVar17 = iVar12 + iVar15;
              uVar19 = iVar12 + iVar15 + 0x1f;
              if (-1 < (int)uVar17) {
                uVar19 = uVar17;
              }
              puVar5 = (this->visited_).ptr_._M_t.
                       super___uniq_ptr_impl<unsigned_int,_re2::PODArray<unsigned_int>::Deleter>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_int_*,_re2::PODArray<unsigned_int>::Deleter>.
                       super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
              uVar2 = puVar5[(int)uVar19 >> 5];
              if ((uVar2 >> (uVar17 & 0x1f) & 1) != 0) goto switchD_001c1ed4_caseD_7;
              puVar5[(int)uVar19 >> 5] = 1 << ((byte)uVar17 & 0x1f) | uVar2;
              lVar22 = (long)(int)uVar16;
              pIVar21 = ((_Head_base<0UL,_re2::Prog::Inst_*,_false> *)
                        ((long)&(this->prog_->inst_).ptr_._M_t.
                                super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                                ._M_t.
                                super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                        + 8))->_M_head_impl;
              uVar19 = pIVar21[lVar22].out_opcode_;
              p = pbVar23;
              switch(uVar19 & 7) {
              case 0:
                goto switchD_001c1ed4_caseD_0;
              case 1:
                goto switchD_001c1ed4_caseD_1;
              case 2:
                goto switchD_001c1ed4_caseD_2;
              case 3:
switchD_001c1ed4_caseD_3:
                if ((uVar19 & 8) == 0) {
                  Push(this,(int)lVar22 + 1,(char *)pbVar23);
                }
                iVar12 = pIVar21[lVar22].field_1.cap_;
                if ((-1 < (long)iVar12) &&
                   (iVar12 < (int)(this->cap_).ptr_._M_t.
                                  super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>
                                  .super__Tuple_impl<1UL,_re2::PODArray<const_char_*>::Deleter>.
                                  super__Head_base<1UL,_re2::PODArray<const_char_*>::Deleter,_false>
                   )) {
                  Push(this,-(int)lVar22,
                       (this->cap_).ptr_._M_t.
                       super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>.
                       _M_t.
                       super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>.
                       super__Head_base<0UL,_const_char_**,_false>._M_head_impl[iVar12]);
                  (this->cap_).ptr_._M_t.
                  super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>._M_t.
                  super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>.
                  super__Head_base<0UL,_const_char_**,_false>._M_head_impl
                  [pIVar21[lVar22].field_1.cap_] = (char *)pbVar23;
                }
                break;
              case 4:
switchD_001c1ed4_caseD_4:
                while( true ) {
                  uVar16 = pIVar21[lVar22].field_1.out1_;
                  uVar13 = Prog::EmptyFlags(&this->context_,(char *)p);
                  uVar19 = pIVar21[lVar22].out_opcode_;
                  pbVar23 = p;
                  if ((uVar16 & ~uVar13) == 0) break;
LAB_001c2033:
                  if ((uVar19 & 8) != 0) goto switchD_001c1ed4_caseD_7;
                  lVar22 = lVar22 + 1;
                  pIVar21 = ((_Head_base<0UL,_re2::Prog::Inst_*,_false> *)
                            ((long)&(this->prog_->inst_).ptr_._M_t.
                                    super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                            + 8))->_M_head_impl;
                  uVar19 = pIVar21[lVar22].out_opcode_;
                  pbVar23 = p;
                  switch(uVar19 & 7) {
                  case 0:
                    goto switchD_001c1ed4_caseD_0;
                  case 1:
                    goto switchD_001c1ed4_caseD_1;
                  case 2:
                    goto switchD_001c1ed4_caseD_2;
                  case 3:
                    goto switchD_001c1ed4_caseD_3;
                  case 5:
switchD_001c1ed4_caseD_5:
                    if ((this->endmatch_ != true) || (p == pbVar20)) {
                      uVar16 = this->nsubmatch_;
                      uVar14 = (ulong)uVar16;
                      if (uVar14 == 0) {
                        return true;
                      }
                      (this->cap_).ptr_._M_t.
                      super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>._M_t
                      .super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>.
                      super__Head_base<0UL,_const_char_**,_false>._M_head_impl[1] = (char *)p;
                      pcVar3 = this->submatch_->data_;
                      if (pcVar3 == (const_pointer)0x0) {
                        if (0 < (int)uVar16) goto LAB_001c20a8;
                      }
                      else if ((this->longest_ == true) &&
                              (pcVar3 + this->submatch_->size_ < p && 0 < (int)uVar16)) {
LAB_001c20a8:
                        lVar18 = 8;
                        do {
                          pSVar7 = this->submatch_;
                          ppcVar8 = (this->cap_).ptr_._M_t.
                                    super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>
                                    .super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
                          lVar9 = *(long *)((long)ppcVar8 + lVar18 + -8);
                          lVar10 = *(long *)((long)ppcVar8 + lVar18);
                          *(long *)((long)pSVar7 + lVar18 + -8) = lVar9;
                          *(long *)((long)&pSVar7->data_ + lVar18) = lVar10 - lVar9;
                          lVar18 = lVar18 + 0x10;
                          uVar14 = uVar14 - 1;
                        } while (uVar14 != 0);
                      }
                      bVar11 = true;
                      if (this->longest_ != true) {
                        return true;
                      }
                      if (p == pbVar20) {
                        return true;
                      }
                    }
                    goto LAB_001c2033;
                  case 6:
                    goto switchD_001c1ed4_caseD_6;
                  case 7:
                    goto switchD_001c1ed4_caseD_7;
                  }
                }
              case 6:
switchD_001c1ed4_caseD_6:
                if ((uVar19 & 8) == 0) {
                  Push(this,(int)lVar22 + 1,(char *)pbVar23);
                }
                break;
              case 5:
                goto switchD_001c1ed4_caseD_5;
              case 7:
                goto switchD_001c1ed4_caseD_7;
              }
            } while( true );
          case 3:
            goto switchD_001c1ed4_caseD_3;
          case 4:
            goto switchD_001c1ed4_caseD_4;
          case 5:
            goto switchD_001c1ed4_caseD_5;
          case 6:
            goto switchD_001c1ed4_caseD_6;
          case 7:
            goto switchD_001c1ed4_caseD_7;
          }
        } while( true );
      case 2:
        goto switchD_001c1ed4_caseD_2;
      case 3:
        goto switchD_001c1ed4_caseD_3;
      case 4:
        goto switchD_001c1ed4_caseD_4;
      case 5:
        goto switchD_001c1ed4_caseD_5;
      case 6:
        goto switchD_001c1ed4_caseD_6;
      }
      goto switchD_001c1ed4_caseD_7;
    }
  }
  return false;
LAB_001c1f24:
  if (this->longest_ == false) goto LAB_001c2033;
  goto LAB_001c1eb3;
}

Assistant:

bool BitState::TrySearch(int id0, const char* p0) {
  bool matched = false;
  const char* end = text_.data() + text_.size();
  njob_ = 0;
  // Push() no longer checks ShouldVisit(),
  // so we must perform the check ourselves.
  if (ShouldVisit(id0, p0))
    Push(id0, p0);
  while (njob_ > 0) {
    // Pop job off stack.
    --njob_;
    int id = job_[njob_].id;
    int& rle = job_[njob_].rle;
    const char* p = job_[njob_].p;

    if (id < 0) {
      // Undo the Capture.
      cap_[prog_->inst(-id)->cap()] = p;
      continue;
    }

    if (rle > 0) {
      p += rle;
      // Revivify job on stack.
      --rle;
      ++njob_;
    }

  Loop:
    // Visit id, p.
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "Unexpected opcode: " << ip->opcode();
        return false;

      case kInstFail:
        break;

      case kInstAltMatch:
        if (ip->greedy(prog_)) {
          // out1 is the Match instruction.
          id = ip->out1();
          p = end;
          goto Loop;
        }
        if (longest_) {
          // ip must be non-greedy...
          // out is the Match instruction.
          id = ip->out();
          p = end;
          goto Loop;
        }
        goto Next;

      case kInstByteRange: {
        int c = -1;
        if (p < end)
          c = *p & 0xFF;
        if (!ip->Matches(c))
          goto Next;

        if (ip->hint() != 0)
          Push(id+ip->hint(), p);  // try the next when we're done
        id = ip->out();
        p++;
        goto CheckAndLoop;
      }

      case kInstCapture:
        if (!ip->last())
          Push(id+1, p);  // try the next when we're done

        if (0 <= ip->cap() && ip->cap() < cap_.size()) {
          // Capture p to register, but save old value first.
          Push(-id, cap_[ip->cap()]);  // undo when we're done
          cap_[ip->cap()] = p;
        }

        id = ip->out();
        goto CheckAndLoop;

      case kInstEmptyWidth:
        if (ip->empty() & ~Prog::EmptyFlags(context_, p))
          goto Next;

        if (!ip->last())
          Push(id+1, p);  // try the next when we're done
        id = ip->out();
        goto CheckAndLoop;

      case kInstNop:
        if (!ip->last())
          Push(id+1, p);  // try the next when we're done
        id = ip->out();

      CheckAndLoop:
        // Sanity check: id is the head of its list, which must
        // be the case if id-1 is the last of *its* list. :)
        DCHECK(id == 0 || prog_->inst(id-1)->last());
        if (ShouldVisit(id, p))
          goto Loop;
        break;

      case kInstMatch: {
        if (endmatch_ && p != end)
          goto Next;

        // We found a match.  If the caller doesn't care
        // where the match is, no point going further.
        if (nsubmatch_ == 0)
          return true;

        // Record best match so far.
        // Only need to check end point, because this entire
        // call is only considering one start position.
        matched = true;
        cap_[1] = p;
        if (submatch_[0].data() == NULL ||
            (longest_ && p > submatch_[0].data() + submatch_[0].size())) {
          for (int i = 0; i < nsubmatch_; i++)
            submatch_[i] =
                StringPiece(cap_[2 * i],
                            static_cast<size_t>(cap_[2 * i + 1] - cap_[2 * i]));
        }

        // If going for first match, we're done.
        if (!longest_)
          return true;

        // If we used the entire text, no longer match is possible.
        if (p == end)
          return true;

        // Otherwise, continue on in hope of a longer match.
        // Note the absence of the ShouldVisit() check here
        // due to execution remaining in the same list.
      Next:
        if (!ip->last()) {
          id++;
          goto Loop;
        }
        break;
      }
    }
  }
  return matched;
}